

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<signed_char,_signed_char,_5>::Addition(char *lhs,char *rhs,char *result)

{
  char cVar1;
  int iVar2;
  undefined1 *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int32_t tmp;
  
  iVar2 = (int)*in_RDI + (int)*in_RSI;
  cVar1 = std::numeric_limits<signed_char>::max();
  if ((iVar2 <= cVar1) && (cVar1 = std::numeric_limits<signed_char>::min(), cVar1 <= iVar2)) {
    *in_RDX = (char)iVar2;
    return true;
  }
  return false;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // 16-bit or less - one or both are signed
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() && tmp >= (std::int32_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }